

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_pipe_send_start(tlstran_pipe *p)

{
  nni_aio *aio_00;
  nni_msg *m;
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  void *pvVar4;
  uint64_t len;
  nni_iov iov [3];
  uint local_2c;
  int niov;
  nni_msg *msg;
  nni_aio *aio;
  nni_aio *txaio;
  tlstran_pipe *p_local;
  
  aio_00 = (nni_aio *)nni_list_first(&p->sendq);
  if (aio_00 != (nni_aio *)0x0) {
    m = nni_aio_get_msg(aio_00);
    sVar1 = nni_msg_len(m);
    sVar2 = nni_msg_header_len(m);
    lVar3 = sVar1 + sVar2;
    p->txlen[0] = (uint8_t)((ulong)lVar3 >> 0x38);
    p->txlen[1] = (uint8_t)((ulong)lVar3 >> 0x30);
    p->txlen[2] = (uint8_t)((ulong)lVar3 >> 0x28);
    p->txlen[3] = (uint8_t)((ulong)lVar3 >> 0x20);
    p->txlen[4] = (uint8_t)((ulong)lVar3 >> 0x18);
    p->txlen[5] = (uint8_t)((ulong)lVar3 >> 0x10);
    p->txlen[6] = (uint8_t)((ulong)lVar3 >> 8);
    p->txlen[7] = (uint8_t)lVar3;
    len = (uint64_t)p->txlen;
    iov[0].iov_buf = (void *)0x8;
    local_2c = 1;
    sVar1 = nni_msg_header_len(m);
    if (sVar1 != 0) {
      iov[0].iov_len = (size_t)nni_msg_header(m);
      iov[1].iov_buf = (void *)nni_msg_header_len(m);
      local_2c = 2;
    }
    sVar1 = nni_msg_len(m);
    if (sVar1 != 0) {
      pvVar4 = nni_msg_body(m);
      iov[(long)(int)local_2c + -1].iov_len = (size_t)pvVar4;
      pvVar4 = (void *)nni_msg_len(m);
      iov[(int)local_2c].iov_buf = pvVar4;
      local_2c = local_2c + 1;
    }
    nni_aio_set_iov(&p->txaio,local_2c,(nni_iov *)&len);
    nng_stream_send(p->tls,&p->txaio);
  }
  return;
}

Assistant:

static void
tlstran_pipe_send_start(tlstran_pipe *p)
{
	nni_aio *txaio;
	nni_aio *aio;
	nni_msg *msg;
	int      niov;
	nni_iov  iov[3];
	uint64_t len;

	if ((aio = nni_list_first(&p->sendq)) == NULL) {
		return;
	}

	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg) + nni_msg_header_len(msg);

	NNI_PUT64(p->txlen, len);

	txaio             = &p->txaio;
	niov              = 0;
	iov[niov].iov_buf = p->txlen;
	iov[niov].iov_len = sizeof(p->txlen);
	niov++;
	if (nni_msg_header_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_header(msg);
		iov[niov].iov_len = nni_msg_header_len(msg);
		niov++;
	}
	if (nni_msg_len(msg) > 0) {
		iov[niov].iov_buf = nni_msg_body(msg);
		iov[niov].iov_len = nni_msg_len(msg);
		niov++;
	}

	nni_aio_set_iov(txaio, niov, iov);
	nng_stream_send(p->tls, txaio);
}